

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  uint fps_00;
  ostream *poVar3;
  ulong uVar4;
  out_of_range *poVar5;
  function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> local_208;
  function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> local_1e8;
  function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> local_1c8;
  function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> local_1a8;
  invalid_argument *ex_2;
  out_of_range *ex_3;
  size_t pos_1;
  undefined1 local_168 [8];
  string execution_mode_string;
  undefined1 local_140 [4];
  int execution_mode;
  byte local_119;
  undefined1 local_118 [7];
  bool images_from_dir;
  path directory_path;
  invalid_argument *ex;
  out_of_range *ex_1;
  ulong uStack_d8;
  int tmp_fps;
  size_t pos;
  undefined1 local_c8 [8];
  string fps_string;
  undefined1 local_a0 [8];
  string filename;
  int cols;
  int rows;
  uint fps;
  VideoCapture local_60 [8];
  VideoCapture video_capture;
  undefined1 local_30 [8];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> filenames;
  char **argv_local;
  int argc_local;
  
  filenames.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         local_30);
  cv::VideoCapture::VideoCapture(local_60);
  if (argc != 4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Expected 3 arguments. Usage: ");
    poVar3 = std::operator<<(poVar3,*(char **)&(filenames.
                                                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_pathname);
    poVar3 = std::operator<<(poVar3,
                             " <path to directory with jpeg images | movie filename> <execution mode> <fps>"
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Available execution modes: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"1 - simple diff");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,
                             "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)"
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"3 - flicker remover on CPU");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"4 - flicker remover on GPU");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"IMPORTANT: all images and videos should be in << ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,800);
    poVar3 = std::operator<<(poVar3,"x");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,600);
    poVar3 = std::operator<<(poVar3," pixel format.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    filename.field_2._12_4_ = 1;
    goto LAB_0011a239;
  }
  pcVar1 = (char *)((filenames.
                     super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_pathname).
                   _M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,pcVar1,(allocator<char> *)(fps_string.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fps_string.field_2._M_local_buf + 0xf));
  pcVar1 = *(char **)((long)&((filenames.
                               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_pathname).
                             field_2 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,pcVar1,(allocator<char> *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  fps_00 = std::__cxx11::stoi((string *)local_c8,&stack0xffffffffffffff28,10);
  uVar4 = std::__cxx11::string::size();
  if (uStack_d8 < uVar4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Error in <fps> command line parameter. Trailing characters after number: "
                            );
    poVar3 = std::operator<<(poVar3,(string *)local_c8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    filename.field_2._12_4_ = 1;
  }
  else if ((int)fps_00 < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Error in <fps> command line parameter. Frames per second must have a positive value."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    filename.field_2._12_4_ = 1;
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               auto_format);
    local_119 = 0;
    bVar2 = std::filesystem::is_directory((path *)local_118);
    if (bVar2) {
      local_119 = 1;
      readFilenames((string *)local_a0,
                    (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)local_30);
      bVar2 = std::
              vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ::empty((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       *)local_30);
      if (!bVar2) goto LAB_001199e9;
      poVar3 = std::operator<<((ostream *)&std::cerr,"Could not find any jpeg files in directory: ")
      ;
      poVar3 = std::operator<<(poVar3,(string *)local_a0);
      poVar3 = std::operator<<(poVar3,".");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
      filename.field_2._12_4_ = 1;
    }
    else {
      std::filesystem::__cxx11::path::string((string *)local_140,(path *)local_118);
      bVar2 = openVideo(local_60,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_001199e9:
        execution_mode_string.field_2._12_4_ = 0;
        pcVar1 = (char *)((filenames.
                           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_pathname).field_2
                         ._M_allocated_capacity;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_168,pcVar1,(allocator<char> *)((long)&pos_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&pos_1 + 7));
        execution_mode_string.field_2._12_4_ =
             std::__cxx11::stoi((string *)local_168,(size_t *)&ex_3,10);
        poVar5 = (out_of_range *)std::__cxx11::string::size();
        if (ex_3 < poVar5) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Error in <execution mode> command line parameter. Trailing characters after number: "
                                  );
          poVar3 = std::operator<<(poVar3,(string *)local_168);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = -1;
        }
        else {
          switch(execution_mode_string.field_2._12_4_) {
          case 1:
            poVar3 = std::operator<<((ostream *)&std::cout,"Simple absolute diff of 2 frames.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            if ((local_119 & 1) == 0) {
              std::function<bool(cv::Mat_const&,cv::Mat_const&)>::
              function<bool(&)(cv::Mat_const&,cv::Mat_const&),void>
                        ((function<bool(cv::Mat_const&,cv::Mat_const&)> *)&local_1c8,simpleDiff);
              bVar2 = iterateVideoFrames(local_60,&local_1c8);
              std::function<bool_(const_cv::Mat_&,_const_cv::Mat_&)>::~function(&local_1c8);
              if (bVar2) {
                argv_local._4_4_ = 0;
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,
                                         "Error occurred while iterating over frames from video file to produce and display diffs."
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
              }
            }
            else {
              std::function<bool(cv::Mat_const&,cv::Mat_const&)>::
              function<bool(&)(cv::Mat_const&,cv::Mat_const&),void>
                        ((function<bool(cv::Mat_const&,cv::Mat_const&)> *)&local_1a8,simpleDiff);
              bVar2 = iterateImages((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                     *)local_30,&local_1a8);
              std::function<bool_(const_cv::Mat_&,_const_cv::Mat_&)>::~function(&local_1a8);
              if (bVar2) {
                argv_local._4_4_ = 0;
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,
                                         "Error occurred while iterating over images to produce and display diffs."
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
              }
            }
            break;
          case 2:
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Simple absolute diff of 2 frames with all pixels with values "
                                    );
            poVar3 = std::operator<<(poVar3,"different than 0 (black) set to 255 (white).");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            if ((local_119 & 1) == 0) {
              std::function<bool(cv::Mat_const&,cv::Mat_const&)>::
              function<bool(&)(cv::Mat_const&,cv::Mat_const&),void>
                        ((function<bool(cv::Mat_const&,cv::Mat_const&)> *)&local_208,simpleDiffMaxed
                        );
              bVar2 = iterateVideoFrames(local_60,&local_208);
              std::function<bool_(const_cv::Mat_&,_const_cv::Mat_&)>::~function(&local_208);
              if (bVar2) {
                argv_local._4_4_ = 0;
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,
                                         "Error occurred while iterating over frames from video file to produce and display diffs "
                                        );
                poVar3 = std::operator<<(poVar3,
                                         "with all pixels with values different than 0 (black) set to 255 (white)."
                                        );
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
              }
            }
            else {
              std::function<bool(cv::Mat_const&,cv::Mat_const&)>::
              function<bool(&)(cv::Mat_const&,cv::Mat_const&),void>
                        ((function<bool(cv::Mat_const&,cv::Mat_const&)> *)&local_1e8,simpleDiffMaxed
                        );
              bVar2 = iterateImages((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                     *)local_30,&local_1e8);
              std::function<bool_(const_cv::Mat_&,_const_cv::Mat_&)>::~function(&local_1e8);
              if (bVar2) {
                argv_local._4_4_ = 0;
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,
                                         "Error occurred while iterating over images to produce and display diffs with all pixels "
                                        );
                poVar3 = std::operator<<(poVar3,
                                         "with values different than 0 (black) set to 255 (white).")
                ;
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
              }
            }
            break;
          case 3:
            poVar3 = std::operator<<((ostream *)&std::cout,"Flicker remover on CPU.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ =
                 flickerRemoverOnCPU((bool)(local_119 & 1),local_60,
                                     (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                      *)local_30,fps_00,600,800);
            break;
          case 4:
            poVar3 = std::operator<<((ostream *)&std::cout,"Flicker remover on GPU.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ =
                 flickerRemoverOnGPU((bool)(local_119 & 1),local_60,
                                     (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                      *)local_30,fps_00,600,800);
            break;
          default:
            poVar3 = std::operator<<((ostream *)&std::cout,"Unknown execution mode: ");
            poVar3 = std::operator<<(poVar3,(string *)local_168);
            poVar3 = std::operator<<(poVar3,". It should be an integral value from range: 1 - 6.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = -1;
          }
        }
        filename.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_168);
      }
      else {
        argv_local._4_4_ = -1;
        filename.field_2._12_4_ = 1;
      }
    }
    std::filesystem::__cxx11::path::~path((path *)local_118);
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
LAB_0011a239:
  cv::VideoCapture::~VideoCapture(local_60);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    vector<path> filenames;
    VideoCapture video_capture;
    unsigned int fps;
    const int rows = 600;
    const int cols = 800;

    if(argc != 4) {
        cout << "Expected 3 arguments. Usage: " << argv[0]
             << " <path to directory with jpeg images | movie filename> <execution mode> <fps>" << endl
             << "Available execution modes: " << endl
             << "1 - simple diff" << endl
             << "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)" << endl
             << "3 - flicker remover on CPU" << endl
             << "4 - flicker remover on GPU" << endl
             << "IMPORTANT: all images and videos should be in << " << cols << "x" << rows << " pixel format." << endl;
        return -1;
    }
    string filename = argv[1];

    string fps_string = argv[3];
    try {
        size_t pos;
        int tmp_fps = stoi(fps_string, &pos);
        if(pos < fps_string.size()) {
            cerr << "Error in <fps> command line parameter. Trailing characters after number: " << fps_string << endl;
            return -1;
        } else if(tmp_fps < 0) {
            cerr << "Error in <fps> command line parameter. Frames per second must have a positive value." << endl;
            return -1;
        } else {
            fps = (unsigned int) tmp_fps;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <fps> command line parameter. Invalid number: " << fps_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <fps> command line parameter. Number out of range: " << fps_string << endl;
        return -1;
    }

    auto directory_path = path(filename);
    bool images_from_dir = false;
    if(is_directory(directory_path)) {
        images_from_dir = true;
        readFilenames(filename, filenames);
        if(filenames.empty()) {
            cerr << "Could not find any jpeg files in directory: "<< filename << "." << endl;
            return -1;
        }
    } else {
        if(!openVideo(video_capture, directory_path.string())) {
            return -1;
        }
    }

    int execution_mode = 0;
    string execution_mode_string = argv[2];
    try {
        size_t pos;
        execution_mode = stoi(execution_mode_string, &pos);
        if(pos < execution_mode_string.size()) {
            cerr << "Error in <execution mode> command line parameter. Trailing characters after number: "
                 << execution_mode_string << endl;
            return -1;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <execution mode> command line parameter. Invalid number: " << execution_mode_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <execution mode> command line parameter. Number out of range: "
             << execution_mode_string << endl;
        return -1;
    }

    switch(execution_mode) {
        case 1:
            cout << "Simple absolute diff of 2 frames." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs."
                         << endl;
                    return -1;
                }
            }
        case 2:
            cout << "Simple absolute diff of 2 frames with all pixels with values "
                 << "different than 0 (black) set to 255 (white)." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs with all pixels "
                         << "with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs "
                         << "with all pixels with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            }
        case 3:
            cout << "Flicker remover on CPU." << endl;
            return flickerRemoverOnCPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        case 4:
            cout << "Flicker remover on GPU." << endl;
            return flickerRemoverOnGPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        default:
            cout << "Unknown execution mode: " << execution_mode_string
                 << ". It should be an integral value from range: 1 - 6." << endl;
            return -1;
    }
}